

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QKbo.hpp
# Opt level: O3

Option<std::tuple<Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>,_unsigned_char>_>
* __thiscall
Kernel::QKbo::atomsWithLvl<Kernel::NumTraits<Kernel::RealConstantType>>
          (Option<std::tuple<Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>,_unsigned_char>_>
           *__return_storage_ptr__,QKbo *this,Literal *literal)

{
  uint uVar1;
  uint uVar2;
  TermList TVar3;
  Term *pTVar4;
  TermList TVar5;
  Self SVar6;
  size_type in_RCX;
  anon_class_1_1_a83b8aa4 clsr;
  initializer_list<Kernel::TermList> args;
  initializer_list<Kernel::TermList> args_00;
  Option<Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>_>
  local_48;
  
  uVar2 = (literal->super_Term)._functor;
  if (uVar2 == 0) {
LAB_0059d619:
    TVar3 = Term::termArg(&literal->super_Term,0);
    pTVar4 = NumTraits<Kernel::RealConstantType>::zeroT();
    uVar2 = (uint)((Term *)TVar3._content == pTVar4);
  }
  else {
    uVar1 = NumTraits<Kernel::RealConstantType>::geqF();
    if (uVar2 != uVar1) {
      uVar1 = NumTraits<Kernel::RealConstantType>::greaterF();
      if (uVar2 != uVar1) {
        TVar3 = Term::termArg(&literal->super_Term,0);
        clsr.level = ((literal->super_Term)._args[0]._content & 4) == 0 | 2;
        goto LAB_0059d6f7;
      }
    }
    uVar2 = 0;
    if ((literal->super_Term)._functor == 0) goto LAB_0059d619;
  }
  if (AlascaSignature<Kernel::NumTraits<Kernel::RealConstantType>>::zeroT == '\0') {
    DAT_00b4bd48 = AlascaSignature<Kernel::NumTraits<Kernel::RealConstantType>_>::numeralTl(0);
    AlascaSignature<Kernel::NumTraits<Kernel::RealConstantType>>::zeroT = '\x01';
  }
  TVar3 = Term::termArg(&literal->super_Term,uVar2 ^ 1);
  if (DAT_00b4bd48._content == TVar3._content) {
    TVar3 = Term::termArg(&literal->super_Term,uVar2);
  }
  else {
    TVar3 = Term::termArg(&literal->super_Term,0);
    TVar5 = Term::termArg(&literal->super_Term,1);
    uVar2 = NumTraits<Kernel::RealConstantType>::minusF();
    args._M_len = in_RCX;
    args._M_array = (iterator)0x1;
    local_48.
    super_OptionBase<Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>_>
    ._0_8_ = TVar5;
    SVar6._M_t.
    super___uniq_ptr_impl<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_std::default_delete<Kernel::WeightedMultiSet<Kernel::SignedTerm>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_Kernel::WeightedMultiSet<Kernel::SignedTerm>_*,_std::default_delete<Kernel::WeightedMultiSet<Kernel::SignedTerm>_>_>
    .super__Head_base<0UL,_Kernel::WeightedMultiSet<Kernel::SignedTerm>_*,_false>._M_head_impl =
         (__uniq_ptr_data<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_std::default_delete<Kernel::WeightedMultiSet<Kernel::SignedTerm>_>,_true,_true>
          )Term::create((Term *)(ulong)uVar2,(uint)&local_48,args);
    uVar2 = NumTraits<Kernel::RealConstantType>::addF();
    args_00._M_len = in_RCX;
    args_00._M_array = (iterator)0x2;
    local_48.
    super_OptionBase<Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>_>
    ._0_8_ = TVar3;
    local_48.
    super_OptionBase<Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>_>
    ._elem._elem.init._self._M_t.
    super___uniq_ptr_impl<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_std::default_delete<Kernel::WeightedMultiSet<Kernel::SignedTerm>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_Kernel::WeightedMultiSet<Kernel::SignedTerm>_*,_std::default_delete<Kernel::WeightedMultiSet<Kernel::SignedTerm>_>_>
    .super__Head_base<0UL,_Kernel::WeightedMultiSet<Kernel::SignedTerm>_*,_false>._M_head_impl =
         (Self)SVar6._M_t.
               super___uniq_ptr_impl<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_std::default_delete<Kernel::WeightedMultiSet<Kernel::SignedTerm>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_Kernel::WeightedMultiSet<Kernel::SignedTerm>_*,_std::default_delete<Kernel::WeightedMultiSet<Kernel::SignedTerm>_>_>
               .super__Head_base<0UL,_Kernel::WeightedMultiSet<Kernel::SignedTerm>_*,_false>.
               _M_head_impl;
    TVar3._content = (uint64_t)Term::create((Term *)(ulong)uVar2,(uint)&local_48,args_00);
  }
  clsr.level = '\x01';
  if ((literal->super_Term)._functor == 0) {
    clsr.level = ((literal->super_Term)._args[0]._content & 4) == 0;
  }
LAB_0059d6f7:
  signedAtoms<Kernel::NumTraits<Kernel::RealConstantType>>(&local_48,this,TVar3);
  Lib::
  Option<Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,Lib::DefaultReset,Lib::DefaultKeepRecycled>>
  ::
  map<Kernel::QKbo::atomsWithLvl<Kernel::NumTraits<Kernel::RealConstantType>>(Kernel::Literal*)const::_lambda(auto:1)_1_>
            (__return_storage_ptr__,&local_48,clsr);
  if (local_48.
      super_OptionBase<Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>_>
      ._isSome == true) {
    Lib::
    Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
    ::~Recycled((Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                 *)&local_48.
                    super_OptionBase<Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>_>
                    ._elem);
  }
  return __return_storage_ptr__;
}

Assistant:

Option<AtomsWithLvl> atomsWithLvl(Literal* literal) const
  {
    using ASig = AlascaSignature<NumTraits>;
    ASS(AlascaState::interpretedPred(literal))
    TermList term;
    uint8_t level;
    auto f = literal->functor();
    if (literal->isEquality() || f == NumTraits::geqF() || f == NumTraits::greaterF()) {
      auto mainIdx = literal->isEquality() && literal->termArg(0) == NumTraits::zero() ? 1 : 0;

      term = ASig::zero() == literal->termArg(1 - mainIdx) 
           ? literal->termArg(mainIdx)
           : NumTraits::add(literal->termArg(0), NumTraits::minus(literal->termArg(1)));

      level = literal->isEquality() 
        ? (literal->isPositive() ? POS_EQ_LEVEL : NEG_EQ_LEVEL)
        :  INEQ_LEVEL;
    } else {
      ASS(f == NumTraits::isIntF());
      term = literal->termArg(0);
      level = literal->isPositive() ? POS_IS_INT_LEVEL : NEG_IS_INT_LEVEL;
    }

    return signedAtoms<NumTraits>(term)
      .map([level](auto atoms) {
          return std::make_tuple(std::move(atoms), level);
      });
  }